

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocatorStrategy.hpp
# Opt level: O2

string * __thiscall
license::locate::LocatorStrategy::get_strategy_name_abi_cxx11_
          (string *__return_storage_ptr__,LocatorStrategy *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_strategy_name);
  return __return_storage_ptr__;
}

Assistant:

const virtual std::string get_strategy_name() const { return m_strategy_name; }